

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

void __thiscall Am_Formula::Am_Formula(Am_Formula *this,Am_FProc_Wrapper *formula,char *name)

{
  Am_Formula_Data *this_00;
  char *name_local;
  Am_FProc_Wrapper *formula_local;
  Am_Formula *this_local;
  
  Am_Registered_Type::Am_Registered_Type(&this->super_Am_Registered_Type);
  (this->super_Am_Registered_Type)._vptr_Am_Registered_Type = (_func_int **)&PTR_ID_004104e0;
  this_00 = (Am_Formula_Data *)operator_new(0x20);
  Am_Formula_Data::Am_Formula_Data(this_00,F_WRAPPER,name);
  this->data = this_00;
  (this->data->form_data).f_wrapper = formula;
  return;
}

Assistant:

Am_Formula::Am_Formula(Am_FProc_Wrapper *formula, const char *name)
{
  data = new Am_Formula_Data(F_WRAPPER, name);
  data->form_data.f_wrapper = formula;
}